

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  pointer pcVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  size_t totalsize;
  size_t sVar8;
  uint uVar9;
  size_t __n;
  anon_union_4_2_77b30072 flag_struct;
  Mat m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  undefined4 local_4b0;
  uint local_4ac;
  pointer local_4a8;
  undefined8 uStack_4a0;
  undefined4 uStack_498;
  undefined4 uStack_494;
  int iStack_490;
  Allocator *local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  size_t sStack_470;
  uint local_45c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  vector<signed_char,_std::allocator<signed_char>_> local_438;
  int local_420;
  Allocator *local_418;
  int iStack_410;
  int iStack_40c;
  undefined8 local_408;
  size_t sStack_400;
  
  if (type == 1) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    local_420 = 1;
    local_418 = (Allocator *)0x0;
    _iStack_410 = CONCAT44(w,1);
    local_408 = 0x100000001;
    sVar8 = (size_t)w;
    sStack_400 = sVar8;
    if (w != 0) {
      local_4a8 = (pointer)0x0;
      iVar4 = posix_memalign(&local_4a8,0x10,sVar8 * 4 + 4);
      if (iVar4 != 0) {
        local_4a8 = (pointer)0x0;
      }
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_4a8;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_4a8 + sVar8 * 2);
      (local_4a8 + sVar8 * 2)[0] = 1;
      (local_4a8 + sVar8 * 2)[1] = 0;
    }
    if (((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) ||
       ((long)local_408._4_4_ * sStack_400 == 0)) {
      __return_storage_ptr__->data =
           local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_001747ac:
      __return_storage_ptr__->refcount =
           (int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __return_storage_ptr__->elemsize =
           CONCAT44(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
                    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_);
      __return_storage_ptr__->elempack = local_420;
      __return_storage_ptr__->allocator = local_418;
      __return_storage_ptr__->dims = iStack_410;
      __return_storage_ptr__->w = iStack_40c;
      __return_storage_ptr__->h = (int)local_408;
      __return_storage_ptr__->c = local_408._4_4_;
      __return_storage_ptr__->cstep = sStack_400;
      if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
             *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
        UNLOCK();
      }
    }
    else {
      uVar3 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,local_438.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(ulong)(uint)(w << 2));
      if (uVar3 == w << 2) {
        __return_storage_ptr__->data =
             local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        goto LAB_001747ac;
      }
      fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar3);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    if (local_418 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_418 + 0x18))();
      return __return_storage_ptr__;
    }
LAB_00174a3a:
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      free(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
  else {
    if (type == 0) {
      uVar3 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_4b0,4);
      if (uVar3 == 4) {
        if (local_4b0 != 0x2c056) {
          if (local_4b0 == 0xd4b38) {
            __n = (size_t)w;
            uVar5 = __n + 3 & 0xfffffffffffffffc;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            std::vector<signed_char,_std::allocator<signed_char>_>::resize
                      (&local_438,(long)(int)(uint)uVar5);
            uVar3 = (*this->dr->_vptr_DataReader[3])
                              (this->dr,local_438.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                               __n + 3 & 0xfffffffc);
            if (uVar3 == (uint)uVar5) {
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->c = 0;
              __return_storage_ptr__->cstep = 0;
              if ((((__return_storage_ptr__->dims != 1) || (__return_storage_ptr__->w != w)) ||
                  (__return_storage_ptr__->elemsize != 1)) ||
                 ((__return_storage_ptr__->elempack != 1 ||
                  (__return_storage_ptr__->allocator != (Allocator *)0x0)))) {
                piVar2 = __return_storage_ptr__->refcount;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
                      if (__return_storage_ptr__->data != (void *)0x0) {
                        free(__return_storage_ptr__->data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)__return_storage_ptr__->allocator + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                __return_storage_ptr__->cstep = 0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->elemsize = 1;
                __return_storage_ptr__->elempack = 1;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 1;
                __return_storage_ptr__->w = w;
                __return_storage_ptr__->h = 1;
                __return_storage_ptr__->c = 1;
                __return_storage_ptr__->cstep = __n;
                if (w != 0) {
                  local_4a8 = (pointer)0x0;
                  iVar4 = posix_memalign(&local_4a8,0x10,uVar5 + 4);
                  if (iVar4 != 0) {
                    local_4a8 = (pointer)0x0;
                  }
                  __return_storage_ptr__->data = local_4a8;
                  __return_storage_ptr__->refcount = (int *)((long)local_4a8 + uVar5);
                  pcVar1 = (pointer)((long)local_4a8 + uVar5);
                  pcVar1[0] = '\x01';
                  pcVar1[1] = '\0';
                  pcVar1[2] = '\0';
                  pcVar1[3] = '\0';
                }
              }
              if ((__return_storage_ptr__->data != (void *)0x0) &&
                 ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
                memcpy(__return_storage_ptr__->data,
                       local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
              }
              goto LAB_00174dbb;
            }
            pcVar6 = "ModelBin read int8_weights failed %d\n";
          }
          else {
            if (local_4b0 != 0x1306b47) {
              uVar3 = local_4b0 >> 8;
              uVar9 = local_4b0 >> 0x10 & 0xff;
              local_4a8 = (pointer)0x0;
              uStack_4a0._0_4_ = 0;
              uStack_4a0._4_4_ = 0;
              uStack_4a0 = (pointer)0x0;
              uStack_498 = 4;
              uStack_494 = 0;
              iStack_490 = 1;
              local_488 = (Allocator *)0x0;
              uStack_480 = CONCAT44(w,1);
              local_478 = 0x100000001;
              sVar8 = (size_t)w;
              sStack_470 = sVar8;
              uVar7 = local_4b0 & 0xff;
              if (w != 0) {
                local_45c = local_4b0 & 0xff;
                local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4ac = uVar9;
                iVar4 = posix_memalign((void **)&local_438,0x10,sVar8 * 4 + 4);
                if (iVar4 != 0) {
                  local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                }
                local_4a8 = (pointer)local_438.
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                uStack_4a0 = (pointer)((long)local_438.
                                             super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      sVar8 * 2 * 2);
                ((pointer)
                ((long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar8 * 2 * 2))[0] = 1;
                ((pointer)
                ((long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar8 * 2 * 2))[1] = 0;
                uVar9 = local_4ac;
                uVar7 = local_45c;
              }
              if ((local_4a8 == (pointer)0x0) || ((long)local_478._4_4_ * sStack_470 == 0)) {
                __return_storage_ptr__->data = local_4a8;
              }
              else {
                if ((uVar3 & 0xff) + uVar7 + uVar9 == 0 && local_4b0._3_1_ == '\0') {
                  if ((char)local_4b0 == '\0') {
                    uVar3 = (*this->dr->_vptr_DataReader[3])
                                      (this->dr,local_4a8,(ulong)(uint)(w << 2));
                    if (uVar3 != w << 2) {
                      pcVar6 = "ModelBin read weight_data failed %d\n";
                      goto LAB_00174e23;
                    }
                  }
                }
                else {
                  uVar3 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_438,0x400);
                  if (uVar3 != 0x400) {
                    pcVar6 = "ModelBin read quantization_value failed %d\n";
LAB_00174e23:
                    fprintf(_stderr,pcVar6,(ulong)uVar3);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                    goto LAB_00174cae;
                  }
                  uVar5 = (ulong)(uint)w + 3;
                  uVar9 = (uint)uVar5 & 0xfffffffc;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_458,(long)(int)uVar9);
                  uVar3 = (*this->dr->_vptr_DataReader[3])
                                    (this->dr,local_458.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                     uVar5 & 0xfffffffc);
                  if (uVar3 == uVar9) {
                    if (0 < w) {
                      uVar5 = 0;
                      do {
                        *(undefined4 *)(local_4a8 + uVar5 * 2) =
                             *(undefined4 *)
                              ((long)&local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                              (ulong)local_458.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar5] * 4);
                        uVar5 = uVar5 + 1;
                      } while ((uint)w != uVar5);
                    }
                  }
                  else {
                    fprintf(_stderr,"ModelBin read index_array failed %d\n",(ulong)uVar3);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                  }
                  if (local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_458.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (uVar3 != uVar9) goto LAB_00174cae;
                }
                __return_storage_ptr__->data = local_4a8;
              }
              __return_storage_ptr__->refcount = (int *)uStack_4a0;
              __return_storage_ptr__->elemsize = CONCAT44(uStack_494,uStack_498);
              __return_storage_ptr__->elempack = iStack_490;
              __return_storage_ptr__->allocator = local_488;
              __return_storage_ptr__->dims = (undefined4)uStack_480;
              __return_storage_ptr__->w = uStack_480._4_4_;
              __return_storage_ptr__->h = (undefined4)local_478;
              __return_storage_ptr__->c = local_478._4_4_;
              __return_storage_ptr__->cstep = sStack_470;
              if (uStack_4a0 != (pointer)0x0) {
                LOCK();
                *(int *)uStack_4a0 = *(int *)uStack_4a0 + 1;
                UNLOCK();
              }
LAB_00174cae:
              if (uStack_4a0 == (pointer)0x0) {
                return __return_storage_ptr__;
              }
              LOCK();
              *(int *)uStack_4a0 = *(int *)uStack_4a0 + -1;
              UNLOCK();
              if (*(int *)uStack_4a0 != 0) {
                return __return_storage_ptr__;
              }
              if (local_488 != (Allocator *)0x0) {
                (**(code **)(*(long *)local_488 + 0x18))();
                return __return_storage_ptr__;
              }
              if (local_4a8 == (pointer)0x0) {
                return __return_storage_ptr__;
              }
              free(local_4a8);
              return __return_storage_ptr__;
            }
            uVar5 = (long)w * 2 + 3;
            uVar9 = (uint)uVar5 & 0xfffffffc;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_438,
                       (long)(int)uVar9);
            uVar3 = (*this->dr->_vptr_DataReader[3])
                              (this->dr,local_438.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,uVar5 & 0xfffffffc
                              );
            if (uVar3 == uVar9) {
              Mat::from_float16(__return_storage_ptr__,
                                (unsigned_short *)
                                local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,w);
              goto LAB_00174dbb;
            }
            pcVar6 = "ModelBin read float16_weights failed %d\n";
          }
          fprintf(_stderr,pcVar6,(ulong)uVar3);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
LAB_00174dbb:
          if ((unsigned_short *)
              local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
            return __return_storage_ptr__;
          }
          operator_delete(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(local_438.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   local_438.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          return __return_storage_ptr__;
        }
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_420 = 1;
        local_418 = (Allocator *)0x0;
        _iStack_410 = CONCAT44(w,1);
        local_408 = 0x100000001;
        sVar8 = (size_t)w;
        sStack_400 = sVar8;
        if (w != 0) {
          local_4a8 = (pointer)0x0;
          iVar4 = posix_memalign(&local_4a8,0x10,sVar8 * 4 + 4);
          if (iVar4 != 0) {
            local_4a8 = (pointer)0x0;
          }
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_4a8;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(local_4a8 + sVar8 * 2);
          (local_4a8 + sVar8 * 2)[0] = 1;
          (local_4a8 + sVar8 * 2)[1] = 0;
        }
        if (((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
           ((long)local_408._4_4_ * sStack_400 == 0)) {
          __return_storage_ptr__->data =
               local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_001749bd:
          __return_storage_ptr__->refcount =
               (int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          __return_storage_ptr__->elemsize =
               CONCAT44(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          __return_storage_ptr__->elempack = local_420;
          __return_storage_ptr__->allocator = local_418;
          __return_storage_ptr__->dims = iStack_410;
          __return_storage_ptr__->w = iStack_40c;
          __return_storage_ptr__->h = (int)local_408;
          __return_storage_ptr__->c = local_408._4_4_;
          __return_storage_ptr__->cstep = sStack_400;
          if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                 *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
            UNLOCK();
          }
        }
        else {
          uVar3 = (*this->dr->_vptr_DataReader[3])
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,(ulong)(uint)(w << 2)
                            );
          if (uVar3 == w << 2) {
            __return_storage_ptr__->data =
                 local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            goto LAB_001749bd;
          }
          fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar3);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
             *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1;
        UNLOCK();
        if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish != 0) {
          return __return_storage_ptr__;
        }
        if (local_418 != (Allocator *)0x0) {
          (**(code **)(*(long *)local_418 + 0x18))();
          return __return_storage_ptr__;
        }
        goto LAB_00174a3a;
      }
      pcVar6 = "ModelBin read flag_struct failed %d\n";
      uVar5 = (ulong)uVar3;
    }
    else {
      pcVar6 = "ModelBin load type %d not implemented\n";
      uVar5 = (ulong)(uint)type;
    }
    fprintf(_stderr,pcVar6,uVar5);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != (int)sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = dr.read(m, w * sizeof(float));
        if (nread != w * (int)sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}